

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool Js::FunctionProxy::SetDisplayName
               (char16 *srcName,char16 **destName,uint displayNameLength,
               ScriptContext *scriptContext,SetDisplayNameFlags flags)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined4 *puVar4;
  Recycler *this;
  char16_t *dst;
  undefined4 in_register_00000014;
  ulong count;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  data._36_4_ = in_register_00000014;
  data.line = displayNameLength;
  if (destName == (char16 **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xaf9,"(destName)","destName");
    if (!bVar3) goto LAB_006cb4be;
    *puVar4 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xafa,"(scriptContext)","scriptContext");
    if (!bVar3) {
LAB_006cb4be:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (srcName == (char16 *)0x0) {
    *destName = L"";
    bVar3 = false;
  }
  else {
    bVar3 = IsConstantFunctionName(srcName);
    uVar2 = data._32_8_;
    if ((flags & SetDisplayNameFlagsDontCopy) == SetDisplayNameFlagsNone && !bVar3) {
      count = (ulong)(data.line + 1);
      local_60 = (undefined1  [8])&char16_t::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_29f156b;
      data.filename._0_4_ = 0xb0b;
      data.plusSize = count;
      this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
      dst = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                      ((Memory *)this,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
      *destName = dst;
      js_wmemcpy_s(dst,count,srcName,count);
      (*destName)[uVar2 & 0xffffffff] = L'\0';
      bVar3 = true;
    }
    else {
      *destName = srcName;
      bVar3 = SUB41((flags & SetDisplayNameFlagsRecyclerAllocated) >> 1,0);
    }
  }
  return bVar3;
}

Assistant:

bool FunctionProxy::SetDisplayName(const char16* srcName, const char16** destName, uint displayNameLength,  ScriptContext * scriptContext, SetDisplayNameFlags flags /* default to None */)
    {
        Assert(destName);
        Assert(scriptContext);

        if (srcName == nullptr)
        {
            *destName = (_u(""));
            return false;
        }
        else if (IsConstantFunctionName(srcName) || (flags & SetDisplayNameFlagsDontCopy) != 0)
        {
            *destName = srcName;
            return (flags & SetDisplayNameFlagsRecyclerAllocated) != 0; // Return true if array is recycler allocated
        }
        else
        {
            uint  numCharacters =  displayNameLength + 1;
            Assert((flags & SetDisplayNameFlagsDontCopy) == 0);

            *destName = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, numCharacters);
            js_wmemcpy_s((char16 *)*destName, numCharacters, srcName, numCharacters);
            ((char16 *)(*destName))[numCharacters - 1] = _u('\0');

            return true;
        }
    }